

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O0

int tnt_request_set_tuple_format(tnt_request *req,char *fmt,...)

{
  char in_AL;
  tnt_stream *ptVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  ssize_t local_40;
  ssize_t res;
  va_list args;
  char *fmt_local;
  tnt_request *req_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  args[0].reg_save_area = fmt;
  if (req->tuple_object == (tnt_stream *)0x0) {
    ptVar1 = tnt_object((tnt_stream *)0x0);
    req->tuple_object = ptVar1;
  }
  else {
    tnt_object_reset(req->tuple_object);
  }
  if (req->tuple_object == (tnt_stream *)0x0) {
    req_local._4_4_ = -1;
  }
  else {
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    res._4_4_ = 0x30;
    res._0_4_ = 0x10;
    local_40 = tnt_object_vformat(req->tuple_object,(char *)args[0].reg_save_area,
                                  (__va_list_tag *)&res);
    if (local_40 == -1) {
      req_local._4_4_ = -1;
    }
    else {
      req_local._4_4_ = tnt_request_set_tuple(req,req->tuple_object);
    }
  }
  return req_local._4_4_;
}

Assistant:

int tnt_request_set_tuple_format(struct tnt_request *req, const char *fmt, ...)
{
	if (req->tuple_object)
		tnt_object_reset(req->tuple_object);
	else
		req->tuple_object = tnt_object(NULL);
	if (!req->tuple_object)
		return -1;
	va_list args;
	va_start(args, fmt);
	ssize_t res = tnt_object_vformat(req->tuple_object, fmt, args);
	va_end(args);
	if (res == -1)
		return -1;
	return tnt_request_set_tuple(req, req->tuple_object);
}